

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = l->tt;
  if (iVar2 == r->tt) {
    if (iVar2 == 4) {
      uVar1 = l_strcmp(&((l->value).gc)->ts,&((r->value).gc)->ts);
      return uVar1 >> 0x1f;
    }
    if (iVar2 == 3) {
      return (uint)((l->value).n <= (r->value).n && (r->value).n != (l->value).n);
    }
    iVar2 = call_orderTM(L,l,r,TM_LT);
    if (iVar2 != -1) {
      return iVar2;
    }
  }
  luaG_ordererror(L,l,r);
  return 0;
}

Assistant:

static int luaV_lessthan(lua_State*L,const TValue*l,const TValue*r){
int res;
if(ttype(l)!=ttype(r))
return luaG_ordererror(L,l,r);
else if(ttisnumber(l))
return luai_numlt(nvalue(l),nvalue(r));
else if(ttisstring(l))
return l_strcmp(rawtsvalue(l),rawtsvalue(r))<0;
else if((res=call_orderTM(L,l,r,TM_LT))!=-1)
return res;
return luaG_ordererror(L,l,r);
}